

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialAnalyzerResults.cpp
# Opt level: O0

void __thiscall
SerialAnalyzerResults::GenerateFrameTabularText
          (SerialAnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  bool bVar1;
  bool bVar2;
  char local_168 [8];
  char result_str [128];
  char local_d8 [8];
  char number_str [128];
  uint local_50;
  U32 bits_per_transfer;
  bool parity_error;
  bool framing_error;
  Frame frame;
  ulonglong local_38;
  byte local_27;
  DisplayBase display_base_local;
  U64 frame_index_local;
  SerialAnalyzerResults *this_local;
  
  AnalyzerResults::ClearTabularText();
  AnalyzerResults::GetFrame((ulonglong)&bits_per_transfer);
  bVar1 = (local_27 & 1) != 0;
  bVar2 = (local_27 & 2) != 0;
  local_50 = this->mSettings->mBitsPerTransfer;
  if (this->mSettings->mSerialMode != Normal) {
    local_50 = local_50 - 1;
  }
  AnalyzerHelpers::GetNumberString(local_38,display_base,local_50,local_d8,0x80);
  if ((local_27 & 4) == 0) {
    if ((bVar2) || (bVar1)) {
      if (bVar1) {
        if (bVar2) {
          snprintf(local_168,0x80,"%s (framing error & parity error)",local_d8);
        }
        else {
          snprintf(local_168,0x80,"%s (framing error)",local_d8);
        }
      }
      else {
        snprintf(local_168,0x80,"%s (parity error)",local_d8);
      }
      AnalyzerResults::AddTabularText
                ((char *)this,local_168,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddTabularText
                ((char *)this,local_d8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
  }
  else if (bVar1) {
    snprintf(local_168,0x80,"Address: %s (framing error)",local_d8);
    AnalyzerResults::AddTabularText
              ((char *)this,local_168,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  else {
    snprintf(local_168,0x80,"Address: %s",local_d8);
    AnalyzerResults::AddTabularText
              ((char *)this,local_168,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  Frame::~Frame((Frame *)&bits_per_transfer);
  return;
}

Assistant:

void SerialAnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
    ClearTabularText();
    Frame frame = GetFrame( frame_index );

    bool framing_error = false;
    if( ( frame.mFlags & FRAMING_ERROR_FLAG ) != 0 )
        framing_error = true;

    bool parity_error = false;
    if( ( frame.mFlags & PARITY_ERROR_FLAG ) != 0 )
        parity_error = true;

    U32 bits_per_transfer = mSettings->mBitsPerTransfer;
    if( mSettings->mSerialMode != SerialAnalyzerEnums::Normal )
        bits_per_transfer--;

    char number_str[ 128 ];
    AnalyzerHelpers::GetNumberString( frame.mData1, display_base, bits_per_transfer, number_str, 128 );

    char result_str[ 128 ];

    // MP mode address case:
    if( ( frame.mFlags & MP_MODE_ADDRESS_FLAG ) != 0 )
    {
        if( framing_error == false )
        {
            snprintf( result_str, sizeof( result_str ), "Address: %s", number_str );
            AddTabularText( result_str );
        }
        else
        {
            snprintf( result_str, sizeof( result_str ), "Address: %s (framing error)", number_str );
            AddTabularText( result_str );
        }
        return;
    }

    // normal case:
    if( ( parity_error == true ) || ( framing_error == true ) )
    {
        if( framing_error == false )
            snprintf( result_str, sizeof( result_str ), "%s (parity error)", number_str );
        else if( parity_error == false )
            snprintf( result_str, sizeof( result_str ), "%s (framing error)", number_str );
        else
            snprintf( result_str, sizeof( result_str ), "%s (framing error & parity error)", number_str );

        AddTabularText( result_str );
    }
    else
    {
        AddTabularText( number_str );
    }
}